

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall cmCTest::SetTest(cmCTest *this,char *ttype,bool report)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  undefined1 auVar2 [16];
  int iVar3;
  Part PVar4;
  size_t sVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ostringstream cmCTestLog_msg;
  undefined1 auStack_1c8 [7];
  allocator<char> local_1c1;
  string local_1c0;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  long lVar8;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,ttype,&local_1c1);
  cmsys::SystemTools::LowerCase((string *)local_1a0,&local_1c0);
  iVar3 = std::__cxx11::string::compare(local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  auVar2 = _DAT_0058e350;
  if (iVar3 == 0) {
    _Var1._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    lVar6 = 0;
    auVar7 = _DAT_0058e330;
    auVar9 = _DAT_0058e340;
    do {
      auVar10 = auVar9 ^ auVar2;
      if (auVar10._4_4_ == -0x80000000 && auVar10._0_4_ < -0x7ffffff4) {
        *(bool *)((long)(_Var1._M_head_impl)->Parts + lVar6 + 0x18U) = true;
        *(bool *)((long)(_Var1._M_head_impl)->Parts + lVar6 + 0x58U) = true;
      }
      auVar10 = auVar7 ^ auVar2;
      if (auVar10._4_4_ == -0x80000000 && auVar10._0_4_ < -0x7ffffff4) {
        *(bool *)((long)(_Var1._M_head_impl)->Parts + lVar6 + 0x98U) = true;
        *(bool *)((long)(_Var1._M_head_impl)->Parts + lVar6 + 0xd8U) = true;
      }
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar8 + 4;
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar8 + 4;
      lVar6 = lVar6 + 0x100;
    } while (lVar6 != 0x300);
  }
  else {
    PVar4 = GetPartFromName(this,ttype);
    if (PVar4 == PartCount) {
      if (report) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"Don\'t know about test \"",0x17);
        if (ttype == (char *)0x0) {
          std::ios::clear((int)auStack_1c8 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) + 0x28);
        }
        else {
          sVar5 = strlen(ttype);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,ttype,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\" yet...",8);
        std::ios::widen((char)(ostream *)local_1a0 + (char)*(undefined8 *)(local_1a0._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_1a0);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
            ,0x327,local_1c0._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        std::ios_base::~ios_base(local_130);
      }
      return false;
    }
    *(bool *)((long)((this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts +
             (ulong)PVar4 * 0x40 + 0x18) = true;
  }
  return true;
}

Assistant:

bool cmCTest::SetTest(const char* ttype, bool report)
{
  if (cmSystemTools::LowerCase(ttype) == "all") {
    for (Part p = PartStart; p != PartCount; p = Part(p + 1)) {
      this->Impl->Parts[p].Enable();
    }
    return true;
  }
  Part p = this->GetPartFromName(ttype);
  if (p != PartCount) {
    this->Impl->Parts[p].Enable();
    return true;
  }
  if (report) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Don't know about test \"" << ttype << "\" yet..."
                                          << std::endl);
  }
  return false;
}